

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O3

Block * __thiscall
Js::CompoundString::BlockInfo::CopyBuffer
          (BlockInfo *this,void *buffer,CharCount usedCharLength,bool reserveMoreSpace,
          Recycler *recycler)

{
  char *addr;
  void *address;
  Block *pBVar1;
  code *pcVar2;
  Type TVar3;
  bool bVar4;
  uint uVar5;
  CharCount count;
  undefined4 *puVar6;
  Block *pBVar7;
  CharCount CVar8;
  
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x178,"(buffer)","buffer");
    if (!bVar4) goto LAB_00b28b1f;
    *puVar6 = 0;
  }
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x179,"(recycler)","recycler");
    if (!bVar4) {
LAB_00b28b1f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  uVar5 = usedCharLength + (usedCharLength == 0);
  CVar8 = uVar5 + 7 & 0xfffffff8;
  if (uVar5 <= CVar8) {
    if (reserveMoreSpace) {
      CVar8 = GrowCharCapacity(CVar8);
    }
    bVar4 = ShouldAllocateBuffer(CVar8);
    if (bVar4) {
      AllocateBuffer(this,CVar8,recycler);
      this->charLength = usedCharLength;
      addr = (char *)(this->buffer).ptr;
      count = Block::PointerLengthFromCharLength(CVar8);
      Memory::Recycler::WBSetBitRange(addr,count);
      js_wmemcpy_s((char16 *)(this->buffer).ptr,(ulong)CVar8,(char16 *)buffer,(ulong)usedCharLength)
      ;
      address = (this->buffer).ptr;
      CVar8 = Block::PointerLengthFromCharLength(this->charLength);
      Memory::RecyclerWriteBarrierManager::WriteBarrier(address,(ulong)CVar8 << 3);
      pBVar7 = (Block *)0x0;
    }
    else {
      pBVar7 = Block::New(buffer,usedCharLength,reserveMoreSpace,recycler);
      pBVar1 = (pBVar7->bufferOwner).ptr;
      Memory::Recycler::WBSetBit((char *)this);
      (this->buffer).ptr = pBVar1 + 1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
      TVar3 = pBVar7->charCapacity;
      this->charLength = pBVar7->charLength;
      this->charCapacity = TVar3;
    }
    return pBVar7;
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

CompoundString::Block *CompoundString::BlockInfo::CopyBuffer(
        const void *const buffer,
        const CharCount usedCharLength,
        const bool reserveMoreSpace,
        Recycler *const recycler)
    {
        Assert(buffer);
        Assert(recycler);

        CharCount charCapacity = AlignCharCapacityForAllocation(usedCharLength);
        if(reserveMoreSpace)
            charCapacity = GrowCharCapacity(charCapacity);
        if(ShouldAllocateBuffer(charCapacity))
        {
            AllocateBuffer(charCapacity, recycler);
            charLength = usedCharLength;

            ArrayWriteBarrierVerifyBits(Block::Pointers(Chars()), Block::PointerLengthFromCharLength(charCapacity));
            js_wmemcpy_s(Chars(), charCapacity, (const char16*)(buffer), usedCharLength);
            // SWB: buffer may contain chars or pointers. Trigger write barrier for the whole buffer.
            ArrayWriteBarrier(Pointers(), PointerLength());
            return nullptr;
        }

        Block *const block = Block::New(buffer, usedCharLength, reserveMoreSpace, recycler);
        CopyFrom(block);
        return block;
    }